

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyline.h
# Opt level: O3

void anurbs::Polyline<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Polyline<3l>,std::shared_ptr<anurbs::Polyline<3l>>> *pcVar1;
  string name;
  class_<anurbs::Polyline<3L>,_std::shared_ptr<anurbs::Polyline<3L>_>_> local_c0;
  code *local_b8;
  undefined8 local_b0;
  long *local_a8;
  long local_98 [2];
  code *local_88;
  undefined8 local_80;
  arg local_78;
  arg local_68;
  arg local_58;
  code *local_48;
  undefined8 local_40;
  arg local_38;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::Polyline<3L>,_std::shared_ptr<anurbs::Polyline<3L>_>_>::class_<>
            (&local_c0,(m->super_object).super_handle.m_ptr,(char *)local_a8);
  local_28.name = "nb_points";
  local_28._8_1_ = 2;
  pybind11::class_<anurbs::Polyline<3L>,_std::shared_ptr<anurbs::Polyline<3L>_>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg>
            (&local_c0,"__init__",(type *)&local_78,(is_new_style_constructor *)&local_b8,&local_28)
  ;
  local_78.name = "points";
  local_78._8_1_ = 2;
  pybind11::class_<anurbs::Polyline<3L>,_std::shared_ptr<anurbs::Polyline<3L>_>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg>
            (&local_c0,"__init__",(type *)&local_b8,(is_new_style_constructor *)&local_88,&local_78)
  ;
  local_b8 = Polyline<3L>::nb_points;
  local_b0 = 0;
  pcVar1 = (class_<anurbs::Polyline<3l>,std::shared_ptr<anurbs::Polyline<3l>>> *)
           pybind11::class_<anurbs::Polyline<3l>,std::shared_ptr<anurbs::Polyline<3l>>>::
           def<long(anurbs::Polyline<3l>::*)()const>
                     ((class_<anurbs::Polyline<3l>,std::shared_ptr<anurbs::Polyline<3l>>> *)
                      &local_c0,"nb_points",(offset_in_Model_to_subr *)&local_b8);
  local_88 = Polyline<3L>::point;
  local_80 = 0;
  local_38.name = "index";
  local_38._8_1_ = 2;
  pcVar1 = (class_<anurbs::Polyline<3l>,std::shared_ptr<anurbs::Polyline<3l>>> *)
           pybind11::class_<anurbs::Polyline<3l>,std::shared_ptr<anurbs::Polyline<3l>>>::
           def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::Polyline<3l>::*)(unsigned_long)const,pybind11::arg>
                     (pcVar1,"point",(offset_in_Model_to_subr *)&local_88,&local_38);
  local_48 = Polyline<3L>::set_point;
  local_40 = 0;
  local_58.name = "index";
  local_58._8_1_ = 2;
  local_68.name = "value";
  local_68._8_1_ = 2;
  pybind11::class_<anurbs::Polyline<3l>,std::shared_ptr<anurbs::Polyline<3l>>>::
  def<void(anurbs::Polyline<3l>::*)(unsigned_long,Eigen::Matrix<double,1,3,1,1,3>const&),pybind11::arg,pybind11::arg>
            (pcVar1,"set_point",(offset_in_Model_to_subr *)&local_48,&local_58,&local_68);
  pybind11::object::~object((object *)&local_c0);
  Model::register_python_data_type<anurbs::Polyline<3l>>(m,model);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Holder = anurbs::Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            .def(py::init<Index>(), "nb_points"_a)
            .def(py::init<std::vector<Vector>>(), "points"_a)
            .def("nb_points", &Type::nb_points)
            .def("point", &Type::point, "index"_a)
            .def("set_point", &Type::set_point, "index"_a, "value"_a)
        ;

        Model::register_python_data_type<Type>(m, model);
    }